

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O2

void __thiscall KMeans::KMeans(KMeans *this,shared_ptr<Launcher> *launcher,size_t k,size_t kappa)

{
  shared_ptr<TreeDecomposition> *this_00;
  size_t sVar1;
  Attribute *pAVar2;
  TDNode *pTVar3;
  mapped_type *pmVar4;
  string *name;
  ulong uVar5;
  ulong attID;
  ulong uVar6;
  size_t clusterID;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__KMeans_0021ebd8;
  (this->_pathToFiles)._M_dataplus._M_p = (pointer)&(this->_pathToFiles).field_2;
  (this->_pathToFiles)._M_string_length = 0;
  (this->_pathToFiles).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>,
             &launcher->super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>);
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_k = k;
  this->_dimensionK = kappa;
  this->_queryRootIndex = (size_t *)0x0;
  (this->clusterVariables).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->clusterVariables).super__Base_bitset<2UL>._M_w[1] = 0;
  (this->categoricalQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->categoricalQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->categoricalQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->continuousQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->continuousQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->continuousQueries).
  super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Launcher::getCompiler((Launcher *)&clusterID);
  std::__shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2> *)&clusterID);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  Launcher::getTreeDecomposition((Launcher *)&clusterID);
  this_00 = &this->_td;
  std::__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2> *)&clusterID);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  loadFeatures(this);
  sVar1 = TreeDecomposition::numberOfAttributes
                    ((this_00->super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->_queryRootIndex;
  local_80 = (element_type *)&this->clusterVariables;
  this->numberOfOriginalVariables = sVar1;
  local_90 = (element_type *)&(this->super_Application)._isCategoricalFeature;
  for (attID = 0; attID != 100; attID = attID + 1) {
    uVar5 = attID >> 6;
    uVar6 = 1L << ((byte)attID & 0x3f);
    if (((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar5] >> (attID & 0x3f)
        & 1) != 0) {
      pAVar2 = TreeDecomposition::getAttribute
                         ((this_00->
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          attID);
      pTVar3 = TreeDecomposition::getRelation
                         ((this_00->
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          (size_t)(local_78._M_pi)->_vptr__Sp_counted_base[attID]);
      local_88._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this_00->super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((_Base_bitset<2UL> *)&local_90->_td)->_M_w[uVar5] & uVar6) == 0) {
        std::operator+(&local_70,"cluster_",&pAVar2->_name);
        name = &local_70;
        TreeDecomposition::addAttribute
                  ((TreeDecomposition *)local_88._M_pi,name,Double,(pair<bool,_double>)ZEXT816(1),
                   pTVar3->_id);
      }
      else {
        std::operator+(&local_50,"cluster_",&pAVar2->_name);
        name = &local_50;
        TreeDecomposition::addAttribute
                  ((TreeDecomposition *)local_88._M_pi,name,Integer,(pair<bool,_double>)ZEXT816(1),
                   pTVar3->_id);
      }
      std::__cxx11::string::~string((string *)name);
      sVar1 = TreeDecomposition::numberOfAttributes
                        ((this_00->super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      clusterID = sVar1 - 1;
      std::bitset<100UL>::set((bitset<100UL> *)local_80,clusterID,true);
      if ((((_Base_bitset<2UL> *)&local_90->_td)->_M_w[uVar5] & uVar6) != 0) {
        std::bitset<100UL>::set((bitset<100UL> *)local_90,clusterID,true);
      }
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&clusterToVariableMap,&clusterID);
      *pmVar4 = attID;
    }
  }
  return;
}

Assistant:

KMeans::KMeans(std::shared_ptr<Launcher> launcher, const size_t k, const size_t kappa) :
    _launcher(launcher), _k(k), _dimensionK(kappa)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();

    // This should be modified in case you want to a different k for each dimension
    // _dimensionK = _k;
    
    loadFeatures();

    numberOfOriginalVariables = _td->numberOfAttributes();

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_isFeature[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        TDNode* node = _td->getRelation(_queryRootIndex[var]);

        if (_isCategoricalFeature[var]) 
            _td->addAttribute("cluster_"+att->_name,Type::Integer,{true,0.0},node->_id);
        else
            _td->addAttribute("cluster_"+att->_name,Type::Double,{true,0.0},node->_id);
            
        size_t clusterID = _td->numberOfAttributes()-1;
        
        clusterVariables.set(clusterID);

        if (_isCategoricalFeature[var])
            _isCategoricalFeature.set(clusterID);

        clusterToVariableMap[clusterID] = var;   
    }
}